

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trimesh_dataset_ensure.h
# Opt level: O0

bool __thiscall trimesh::dataset_t::compare_cells<2>(dataset_t *this,cellid_t *c1,cellid_t *c2)

{
  bool bVar1;
  bool bVar2;
  cellid_t *pcVar3;
  type ptVar4;
  int local_30;
  bool is_bnd_f2;
  cellid_t cStack_2c;
  bool is_bnd_f1;
  cellid_t f2;
  cellid_t f1;
  cellid_t *c2_local;
  cellid_t *c1_local;
  dataset_t *this_local;
  
  _f2 = c2;
  c2_local = c1;
  c1_local = (cellid_t *)this;
  pcVar3 = max_fct(this,*c1);
  cStack_2c = *pcVar3;
  pcVar3 = max_fct(this,*_f2);
  local_30 = *pcVar3;
  if (cStack_2c == local_30) {
    ptVar4 = boost::shared_ptr<tri_cc_t>::operator->(&this->m_tcc);
    cStack_2c = tri_cc_t::get_opp_cell(ptVar4,cStack_2c,*c2_local);
    ptVar4 = boost::shared_ptr<tri_cc_t>::operator->(&this->m_tcc);
    local_30 = tri_cc_t::get_opp_cell(ptVar4,local_30,*_f2);
    ptVar4 = boost::shared_ptr<tri_cc_t>::operator->(&this->m_tcc);
    bVar1 = tri_cc_t::is_cell_boundry(ptVar4,cStack_2c);
    ptVar4 = boost::shared_ptr<tri_cc_t>::operator->(&this->m_tcc);
    bVar2 = tri_cc_t::is_cell_boundry(ptVar4,local_30);
    this_local._7_1_ = bVar1;
    if (bVar1 == bVar2) {
      this_local._7_1_ = compare_cells<0>(this,&stack0xffffffffffffffd4,&local_30);
    }
  }
  else {
    this_local._7_1_ = compare_cells<1>(this,&stack0xffffffffffffffd4,&local_30);
  }
  return this_local._7_1_;
}

Assistant:

inline bool dataset_t::compare_cells(const cellid_t & c1, const cellid_t &c2) const
  {
    cellid_t f1 = max_fct(c1);
    cellid_t f2 = max_fct(c2);

    if(f1 != f2)
      return compare_cells<dim-1>(f1,f2);

    f1 = m_tcc->get_opp_cell(f1,c1);
    f2 = m_tcc->get_opp_cell(f2,c2);

    bool is_bnd_f1 = m_tcc->is_cell_boundry(f1);
    bool is_bnd_f2 = m_tcc->is_cell_boundry(f2);

    if(is_bnd_f1 != is_bnd_f2)
      return (is_bnd_f1);

    return compare_cells<0>(f1,f2);
  }